

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddDecomp.c
# Opt level: O3

Conjuncts *
CheckTablesCacheAndReturn(DdNode *node,DdNode *g,DdNode *h,st__table *ghTable,st__table *cacheTable)

{
  uint uVar1;
  int iVar2;
  Conjuncts *value_00;
  DdNode *pDVar3;
  char *key;
  char *pcVar4;
  int value;
  uint local_44;
  st__table *local_40;
  DdNode *local_38;
  
  local_44 = 0;
  local_38 = node;
  uVar1 = PairInTables(g,h,ghTable);
  if (uVar1 == 0) {
    __assert_fail("pairValue != NONE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/cudd/cuddDecomp.c"
                  ,0x3f0,
                  "Conjuncts *CheckTablesCacheAndReturn(DdNode *, DdNode *, DdNode *, st__table *, st__table *)"
                 );
  }
  value_00 = (Conjuncts *)malloc(0x10);
  if (value_00 == (Conjuncts *)0x0) {
    return (Conjuncts *)0x0;
  }
  pDVar3 = g;
  if ((uVar1 == 8) || (uVar1 == 5)) {
    if (one == g) goto switchD_00780a73_caseD_1;
    local_44 = 0;
    pcVar4 = (char *)((ulong)g & 0xfffffffffffffffe);
    local_40 = cacheTable;
    iVar2 = st__lookup_int(ghTable,pcVar4,(int *)&local_44);
    uVar1 = local_44 | 1;
    local_44 = 1;
LAB_007809eb:
    cacheTable = local_40;
    if (iVar2 != 0) {
      local_44 = uVar1;
    }
    iVar2 = st__insert(ghTable,pcVar4,(char *)(long)(int)local_44);
LAB_00780a07:
    if (iVar2 == -10000) {
      return (Conjuncts *)0x0;
    }
  }
  else if ((uVar1 & 0xb) == 3) {
    if (one != h) {
      local_44 = 0;
      pcVar4 = (char *)((ulong)h & 0xfffffffffffffffe);
      local_40 = cacheTable;
      iVar2 = st__lookup_int(ghTable,pcVar4,(int *)&local_44);
      uVar1 = local_44 | 2;
      local_44 = 2;
      goto LAB_007809eb;
    }
switchD_00780a73_caseD_1:
  }
  else {
    switch(uVar1) {
    case 1:
      goto switchD_00780a73_caseD_1;
    case 2:
      break;
    default:
      goto switchD_00780a73_caseD_3;
    case 4:
      if (one != h) {
        local_44 = 1;
        key = (char *)((ulong)h & 0xfffffffffffffffe);
        pcVar4 = (char *)0x1;
LAB_00780aee:
        iVar2 = st__insert(ghTable,key,pcVar4);
        pDVar3 = h;
        h = g;
        goto LAB_00780a07;
      }
      break;
    case 6:
      if (one != g) {
        local_44 = 2;
        key = (char *)((ulong)g & 0xfffffffffffffffe);
        pcVar4 = (char *)0x2;
        goto LAB_00780aee;
      }
    }
    pDVar3 = h;
    h = g;
  }
  value_00->g = pDVar3;
  value_00->h = h;
switchD_00780a73_caseD_3:
  iVar2 = st__insert(cacheTable,(char *)local_38,(char *)value_00);
  if (iVar2 == -10000) {
    free(value_00);
    return (Conjuncts *)0x0;
  }
  return value_00;
}

Assistant:

static Conjuncts *
CheckTablesCacheAndReturn(
  DdNode * node,
  DdNode * g,
  DdNode * h,
  st__table * ghTable,
  st__table * cacheTable)
{
    int pairValue;
    int value;
    Conjuncts *factors;
    
    value = 0;
    /* check tables */
    pairValue = PairInTables(g, h, ghTable);
    assert(pairValue != NONE);
    /* if both dont exist in table, we know one exists(either g or h).
     * Therefore store the other and proceed
     */
    factors = ABC_ALLOC(Conjuncts, 1);
    if (factors == NULL) return(NULL);
    if ((pairValue == BOTH_H) || (pairValue == H_ST)) {
        if (g != one) {
            value = 0;
            if ( st__lookup_int(ghTable, (char *)Cudd_Regular(g), &value)) {
                value |= 1;
            } else {
                value = 1;
            }
            if ( st__insert(ghTable, (char *)Cudd_Regular(g),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                return(NULL);
            }
        }
        factors->g = g;
        factors->h = h;
    } else  if ((pairValue == BOTH_G) || (pairValue == G_ST)) {
        if (h != one) {
            value = 0;
            if ( st__lookup_int(ghTable, (char *)Cudd_Regular(h), &value)) {
                value |= 2;
            } else {
                value = 2;
            }
            if ( st__insert(ghTable, (char *)Cudd_Regular(h),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                return(NULL);
            }
        }
        factors->g = g;
        factors->h = h;
    } else if (pairValue == H_CR) {
        if (g != one) {
            value = 2;
            if ( st__insert(ghTable, (char *)Cudd_Regular(g),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                return(NULL);
            }
        }
        factors->g = h;
        factors->h = g;
    } else if (pairValue == G_CR) {
        if (h != one) {
            value = 1;
            if ( st__insert(ghTable, (char *)Cudd_Regular(h),
                          (char *)(long)value) == st__OUT_OF_MEM) {
                return(NULL);
            }
        }
        factors->g = h;
        factors->h = g;
    } else if (pairValue == PAIR_CR) {
    /* pair exists in table */
        factors->g = h;
        factors->h = g;
    } else if (pairValue == PAIR_ST) {
        factors->g = g;
        factors->h = h;
    }
            
    /* cache the result for this node */
    if ( st__insert(cacheTable, (char *)node, (char *)factors) == st__OUT_OF_MEM) {
        ABC_FREE(factors);
        return(NULL);
    }

    return(factors);

}